

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNameTreeObjectHelper.cc
# Opt level: O1

bool __thiscall QPDFNameTreeObjectHelper::hasName(QPDFNameTreeObjectHelper *this,string *name)

{
  bool bVar1;
  iterator i;
  iterator iStack_98;
  iterator local_50;
  
  find(&local_50,this,name,false);
  end(&iStack_98,this);
  bVar1 = NNTreeIterator::operator==
                    (local_50.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,iStack_98.impl.
                            super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  iterator::~iterator(&iStack_98);
  iterator::~iterator(&local_50);
  return !bVar1;
}

Assistant:

bool
QPDFNameTreeObjectHelper::hasName(std::string const& name)
{
    auto i = find(name);
    return (i != end());
}